

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# color.cpp
# Opt level: O3

array<unsigned_char,_3UL> gen_color(Color pixel_color,int n_samples)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  
  dVar4 = 1.0 / (double)n_samples;
  dVar1 = pow(pixel_color.e[0] * dVar4,0.45454545454545453);
  dVar2 = pow(pixel_color.e[1] * dVar4,0.45454545454545453);
  dVar3 = pow(dVar4 * pixel_color.e[2],0.45454545454545453);
  dVar4 = 0.0;
  if (0.0 <= dVar1) {
    dVar4 = dVar1;
  }
  dVar1 = 0.999;
  if (dVar4 <= 0.999) {
    dVar1 = dVar4;
  }
  dVar4 = 0.0;
  if (0.0 <= dVar2) {
    dVar4 = dVar2;
  }
  dVar2 = 0.999;
  if (dVar4 <= 0.999) {
    dVar2 = dVar4;
  }
  dVar4 = 0.0;
  if (0.0 <= dVar3) {
    dVar4 = dVar3;
  }
  dVar3 = 0.999;
  if (dVar4 <= 0.999) {
    dVar3 = dVar4;
  }
  return (_Type)((uint3)(int)(dVar1 * 256.0) & 0xff |
                (uint3)(((int)(dVar2 * 256.0) & 0xffU) << 8) | (uint3)((int)(dVar3 * 256.0) << 0x10)
                );
}

Assistant:

std::array<uint8_t, 3> gen_color( Color pixel_color, int n_samples) {
  double r = pixel_color.x();
  double g = pixel_color.y();
  double b = pixel_color.z();

  // Divide by the total number of samples per pixel
  auto rcp_samples = 1.0 / n_samples;
  r *= rcp_samples;
  g *= rcp_samples;
  b *= rcp_samples;

  // Gamma correction: adjusting for perceived brightness vs. linear brightness
  r = std::pow(r, RCP_GAMMA);
  g = std::pow(g, RCP_GAMMA);
  b = std::pow(b, RCP_GAMMA);
  const double color_min = 0.0;
  const double color_max = 0.999;
  return {static_cast<uint8_t>(RGB_MAX * clamp(r, color_min, color_max)),
          static_cast<uint8_t>(RGB_MAX * clamp(g, color_min, color_max)),
          static_cast<uint8_t>(RGB_MAX * clamp(b, color_min, color_max))};
}